

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::start(socks5 *this,proxy_settings *ps)

{
  resolver_interface *prVar1;
  proxy_settings *ppVar2;
  undefined1 local_80 [64];
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  local_40;
  byte local_19;
  proxy_settings *local_18;
  proxy_settings *ps_local;
  socks5 *this_local;
  
  local_18 = ps;
  ps_local = (proxy_settings *)this;
  proxy_settings::operator=(&this->m_proxy_settings,ps);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(&this->m_proxy_addr,local_18->port);
  ppVar2 = local_18;
  prVar1 = this->m_resolver;
  local_19 = 2;
  local_80._16_8_ = on_name_lookup;
  local_80._24_4_ = 0;
  local_80[0x1c] = '\0';
  local_80._29_3_ = 0;
  self((socks5 *)local_80);
  ::std::
  bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((type *)(local_80 + 0x20),(offset_in_socks5_to_subr *)(local_80 + 0x10),
             (shared_ptr<libtorrent::aux::socks5> *)local_80,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
            );
  ::std::
  function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
  ::
  function<std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,void>
            ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
              *)&local_40,
             (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
              *)(local_80 + 0x20));
  (**prVar1->_vptr_resolver_interface)(prVar1,ppVar2,(ulong)local_19,&local_40);
  ::std::
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  ::~function(&local_40);
  ::std::
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
            *)(local_80 + 0x20));
  ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
            ((shared_ptr<libtorrent::aux::socks5> *)local_80);
  return;
}

Assistant:

void socks5::start(aux::proxy_settings const& ps)
{
	m_proxy_settings = ps;

	ADD_OUTSTANDING_ASYNC("socks5::on_name_lookup");
	m_proxy_addr.port(ps.port);
	m_resolver.async_resolve(ps.hostname, aux::resolver_interface::abort_on_shutdown
		, std::bind(&socks5::on_name_lookup, self(), _1, _2));
}